

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

RegistryHub ** Catch::anon_unknown_23::getTheRegistryHub(void)

{
  undefined **in_RAX;
  RegistryHub *pRVar1;
  _Rb_tree_header *p_Var2;
  
  if (getTheRegistryHub::theRegistryHub == (RegistryHub *)0x0) {
    pRVar1 = (RegistryHub *)operator_new(0xd0);
    (pRVar1->super_IRegistryHub)._vptr_IRegistryHub = (_func_int **)&PTR__RegistryHub_00182220;
    (pRVar1->super_IMutableRegistryHub)._vptr_IMutableRegistryHub =
         (_func_int **)&PTR__RegistryHub_00182278;
    TestRegistry::TestRegistry(&pRVar1->m_testCaseRegistry);
    (pRVar1->m_reporterRegistry).super_IReporterRegistry._vptr_IReporterRegistry =
         (_func_int **)&PTR__ReporterRegistry_00182538;
    (pRVar1->m_reporterRegistry).m_factories._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         _S_red;
    p_Var2 = &(pRVar1->m_reporterRegistry).m_factories._M_t._M_impl.super__Rb_tree_header;
    (pRVar1->m_reporterRegistry).m_factories._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
         = (_Base_ptr)0x0;
    (pRVar1->m_reporterRegistry).m_factories._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var2->_M_header;
    (pRVar1->m_reporterRegistry).m_factories._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var2->_M_header;
    (pRVar1->m_reporterRegistry).m_factories._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    (pRVar1->m_reporterRegistry).m_listeners.
    super__Vector_base<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar1->m_reporterRegistry).m_listeners.
    super__Vector_base<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar1->m_reporterRegistry).m_listeners.
    super__Vector_base<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    in_RAX = &PTR__ExceptionTranslatorRegistry_00182588;
    (pRVar1->m_exceptionTranslatorRegistry).super_IExceptionTranslatorRegistry.
    _vptr_IExceptionTranslatorRegistry = (_func_int **)&PTR__ExceptionTranslatorRegistry_00182588;
    (pRVar1->m_exceptionTranslatorRegistry).m_translators.
    super__Vector_base<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar1->m_exceptionTranslatorRegistry).m_translators.
    super__Vector_base<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar1->m_exceptionTranslatorRegistry).m_translators.
    super__Vector_base<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    getTheRegistryHub::theRegistryHub = pRVar1;
  }
  return (RegistryHub **)in_RAX;
}

Assistant:

inline RegistryHub*& getTheRegistryHub() {
			static RegistryHub* theRegistryHub = CATCH_NULL;
			if (!theRegistryHub)
				theRegistryHub = new RegistryHub();
			return theRegistryHub;
		}